

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O0

bool Limonp::Logger::Logging(uint level,string *msg,char *fileName,int lineNo)

{
  undefined8 uVar1;
  undefined *puVar2;
  FILE *__stream;
  ostream *this;
  tm *__tp;
  size_t sVar3;
  undefined8 uVar4;
  uint in_ECX;
  undefined8 in_RDX;
  uint in_EDI;
  size_t ret;
  time_t timeNow;
  char buf [1024];
  time_t local_430;
  char local_428 [1036];
  uint local_1c;
  undefined8 local_18;
  uint local_8;
  bool local_1;
  
  if (in_EDI < 5) {
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_8 = in_EDI;
    time(&local_430);
    puVar2 = LOG_TIME_FORMAT;
    __tp = localtime(&local_430);
    sVar3 = strftime(local_428,0x400,puVar2,__tp);
    __stream = _stderr;
    puVar2 = LOG_FORMAT;
    if (sVar3 == 0) {
      fprintf(_stderr,"stftime failed.\n");
      local_1 = false;
    }
    else {
      uVar1 = *(undefined8 *)(LOG_LEVEL_ARRAY + (ulong)local_8 * 8);
      uVar4 = std::__cxx11::string::c_str();
      fprintf(__stream,puVar2,local_428,local_18,(ulong)local_1c,uVar1,uVar4);
      local_1 = true;
    }
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"level\'s value is out of range");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Logging(uint level, const string& msg, const char* fileName, int lineNo)
            {
                if(level > LL_FATAL)
                {
                    cerr<<"level's value is out of range"<<endl;
                    return false;
                }
                char buf[CSTR_BUFFER_SIZE];
                time_t timeNow;
                time(&timeNow);
                size_t ret = strftime(buf, sizeof(buf), LOG_TIME_FORMAT, localtime(&timeNow));
                if(0 == ret)
                {
                    fprintf(stderr, "stftime failed.\n");
                    return false;
                }
                fprintf(stderr, LOG_FORMAT, buf, fileName, lineNo,LOG_LEVEL_ARRAY[level], msg.c_str());
                return true;
            }